

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferingScanTarget.cpp
# Opt level: O1

uint8_t * __thiscall
Outputs::Display::BufferingScanTarget::begin_data
          (BufferingScanTarget *this,size_t required_length,size_t required_alignment)

{
  size_t sVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint8_t *puVar8;
  
  if (required_alignment == 0) {
    __assert_fail("required_alignment",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/ScanTargets/BufferingScanTarget.cpp"
                  ,0x21,
                  "virtual uint8_t *Outputs::Display::BufferingScanTarget::begin_data(size_t, size_t)"
                 );
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->producer_mutex_);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  if (this->allocation_has_failed_ == false) {
    puVar8 = this->write_area_;
    if ((puVar8 != (uint8_t *)0x0) && (sVar1 = this->data_type_size_, sVar1 != 0)) {
      uVar4 = (this->write_pointers_).write_area;
      uVar6 = uVar4 >> 0xb;
      uVar3 = (uVar4 & 0x7ff) +
              (int)((required_alignment - (ulong)((uVar4 & 0x7ff) + 1) % required_alignment) %
                   required_alignment) + 1;
      uVar7 = (int)required_length + uVar3 + 1;
      if (0x800 < (uVar7 & 0xffff)) {
        uVar6 = uVar6 + 1 & 0x7ff;
        uVar7 = (int)required_length + 1 + (uint)required_alignment;
        uVar3 = (uint)required_alignment;
      }
      iVar2 = (this->read_pointers_)._M_i.write_area;
      if ((uVar4 - iVar2 & 0x3fffff) <= ((uVar7 & 0xffff | uVar6 << 0xb) - iVar2 & 0x3fffff)) {
        if (this->data_is_allocated_ == true) {
          __assert_fail("!data_is_allocated_",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/ScanTargets/BufferingScanTarget.cpp"
                        ,0x51,
                        "virtual uint8_t *Outputs::Display::BufferingScanTarget::begin_data(size_t, size_t)"
                       );
        }
        this->data_is_allocated_ = true;
        uVar4 = uVar3 & 0xffff | uVar6 << 0xb & 0x7fff800;
        (this->write_pointers_).write_area = uVar4;
        this->vended_write_area_pointer_ = uVar4;
        if ((uVar4 == 0) ||
           (uVar5 = (required_length + uVar4 + 1) * sVar1,
           sVar1 * 0x400000 <= uVar5 && uVar5 + sVar1 * -0x400000 != 0)) {
          __assert_fail("write_pointers_.write_area >= 1 && ((size_t(write_pointers_.write_area) + required_length + 1) * data_type_size_) <= WriteAreaWidth*WriteAreaHeight*data_type_size_"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/ScanTargets/BufferingScanTarget.cpp"
                        ,0x55,
                        "virtual uint8_t *Outputs::Display::BufferingScanTarget::begin_data(size_t, size_t)"
                       );
        }
        puVar8 = puVar8 + sVar1 * uVar4;
        goto LAB_003dd9df;
      }
    }
    this->allocation_has_failed_ = true;
  }
  puVar8 = (uint8_t *)0x0;
LAB_003dd9df:
  pthread_mutex_unlock((pthread_mutex_t *)&this->producer_mutex_);
  return puVar8;
}

Assistant:

uint8_t *BufferingScanTarget::begin_data(size_t required_length, size_t required_alignment) {
	assert(required_alignment);

	// Acquire the standard producer lock, nominally over write_pointers_.
	std::lock_guard lock_guard(producer_mutex_);

	// If allocation has already failed on this line, continue the trend.
	if(allocation_has_failed_) return nullptr;

	// If there isn't yet a write area or data size then mark allocation as failed and finish.
	if(!write_area_ || !data_type_size_) {
		allocation_has_failed_ = true;
		return nullptr;
	}

	// Determine where the proposed write area would start and end.
	uint16_t output_y = TextureAddressGetY(write_pointers_.write_area);

	uint16_t aligned_start_x = TextureAddressGetX(write_pointers_.write_area & 0xffff) + 1;
	aligned_start_x += uint16_t((required_alignment - aligned_start_x%required_alignment)%required_alignment);

	uint16_t end_x = aligned_start_x + uint16_t(1 + required_length);

	if(end_x > WriteAreaWidth) {
		output_y = (output_y + 1) % WriteAreaHeight;
		aligned_start_x = uint16_t(required_alignment);
		end_x = aligned_start_x + uint16_t(1 + required_length);
	}

	// Check whether that steps over the read pointer; if so then the final address will be closer
	// to the write pointer than the old.
	const auto end_address = TextureAddress(end_x, output_y);
	const auto read_pointers = read_pointers_.load(std::memory_order::memory_order_relaxed);

	const auto end_distance = TextureSub(end_address, read_pointers.write_area);
	const auto previous_distance = TextureSub(write_pointers_.write_area, read_pointers.write_area);

	// Perform a quick sanity check.
	assert(end_distance >= 0);
	assert(previous_distance >= 0);

	// If allocating this would somehow make the write pointer back away from the read pointer,
	// there must not be enough space left.
	if(end_distance < previous_distance) {
		allocation_has_failed_ = true;
		return nullptr;
	}

	// Everything checks out, note expectation of a future end_data and return the pointer.
	assert(!data_is_allocated_);
	data_is_allocated_ = true;
	vended_write_area_pointer_ = write_pointers_.write_area = TextureAddress(aligned_start_x, output_y);

	assert(write_pointers_.write_area >= 1 && ((size_t(write_pointers_.write_area) + required_length + 1) * data_type_size_) <= WriteAreaWidth*WriteAreaHeight*data_type_size_);
	return &write_area_[size_t(write_pointers_.write_area) * data_type_size_];

	// Note state at exit:
	//		write_pointers_.write_area points to the first pixel the client is expected to draw to.
}